

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int lws_cache_nscookiejar_expunge(lws_cache_ttl_lru *_c)

{
  int iVar1;
  
  if (_c == (lws_cache_ttl_lru *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = unlink((char *)(_c->info).u);
    if (iVar1 != 0) {
      _lws_log(2,"%s: failed to unlink %s\n","lws_cache_nscookiejar_expunge",(_c->info).u);
    }
  }
  return iVar1;
}

Assistant:

static int
lws_cache_nscookiejar_expunge(struct lws_cache_ttl_lru *_c)
{
	lws_cache_nscookiejar_t *cache = (lws_cache_nscookiejar_t *)_c;
	int r;

	if (!cache)
		return 0;

	r = unlink(cache->cache.info.u.nscookiejar.filepath);
	if (r)
		lwsl_warn("%s: failed to unlink %s\n", __func__,
				cache->cache.info.u.nscookiejar.filepath);

	return r;
}